

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O3

void __thiscall
capnp::FlatArrayMessageReader::FlatArrayMessageReader
          (FlatArrayMessageReader *this,ArrayPtr<const_capnp::word> array,ReaderOptions options)

{
  Array<kj::ArrayPtr<const_capnp::word>_> *pAVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  ArrayPtr<const_capnp::word> *pAVar5;
  ulong uVar6;
  long lVar7;
  unsigned_long *puVar8;
  long lVar9;
  word *pwVar10;
  unsigned_long *elementCount;
  uint uVar11;
  ReaderOptions options_00;
  Fault f;
  size_t offset;
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  
  puVar8 = (unsigned_long *)array.size_;
  pwVar10 = array.ptr;
  options_00._8_8_ = options._8_8_ & 0xffffffff;
  options_00.traversalLimitInWords = options.traversalLimitInWords;
  MessageReader::MessageReader(&this->super_MessageReader,options_00);
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__FlatArrayMessageReader_001bc9b0;
  (this->segment0).ptr = (word *)0x0;
  (this->segment0).size_ = 0;
  (this->moreSegments).ptr = (ArrayPtr<const_capnp::word> *)0x0;
  (this->moreSegments).size_ = 0;
  (this->moreSegments).disposer = (ArrayDisposer *)0x0;
  this->end = pwVar10 + (long)puVar8;
  if (puVar8 != (unsigned_long *)0x0) {
    pAVar1 = &this->moreSegments;
    uVar11 = (uint)pwVar10->content;
    elementCount = (unsigned_long *)(ulong)uVar11;
    uVar11 = uVar11 + 1;
    offset = (size_t)((uVar11 >> 1) + 1);
    _kjCondition.right = &offset;
    _kjCondition.op.content.ptr = " >= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = offset <= puVar8;
    _kjCondition.left = (unsigned_long)puVar8;
    if (puVar8 < offset) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&,char_const(&)[43]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
                 ,0x2f,FAILED,"array.size() >= offset",
                 "_kjCondition,\"Message ends prematurely in segment table.\"",&_kjCondition,
                 (char (*) [43])"Message ends prematurely in segment table.");
      kj::_::Debug::Fault::~Fault(&f);
    }
    else {
      uVar6 = (ulong)*(uint *)((long)&pwVar10->content + 4);
      _kjCondition.right = (unsigned_long *)(offset + uVar6);
      _kjCondition.op.content.ptr = " >= ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = _kjCondition.right <= puVar8;
      if (puVar8 < _kjCondition.right) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[43]>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
                   ,0x37,FAILED,"array.size() >= offset + segmentSize",
                   "_kjCondition,\"Message ends prematurely in first segment.\"",
                   (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,
                   (char (*) [43])"Message ends prematurely in first segment.");
        kj::_::Debug::Fault::~Fault(&f);
      }
      else {
        (this->segment0).ptr = pwVar10 + offset;
        (this->segment0).size_ = uVar6;
        if (1 < uVar11) {
          offset = (size_t)_kjCondition.right;
          pAVar5 = (ArrayPtr<const_capnp::word> *)
                   kj::_::HeapArrayDisposer::allocateImpl
                             (0x10,(size_t)elementCount,(size_t)elementCount,
                              kj::_::HeapArrayDisposer::Allocate_<kj::ArrayPtr<const_capnp::word>_>
                              ::construct,
                              kj::ArrayDisposer::Dispose_<kj::ArrayPtr<const_capnp::word>_>::
                              destruct);
          _kjCondition.op.content.ptr = (char *)&kj::_::HeapArrayDisposer::instance;
          pAVar2 = pAVar1->ptr;
          if (pAVar2 != (ArrayPtr<const_capnp::word> *)0x0) {
            sVar3 = (this->moreSegments).size_;
            pAVar1->ptr = (ArrayPtr<const_capnp::word> *)0x0;
            (this->moreSegments).size_ = 0;
            pAVar4 = (this->moreSegments).disposer;
            _kjCondition.left = (unsigned_long)pAVar5;
            _kjCondition.right = elementCount;
            (*(code *)**(undefined8 **)pAVar4)(pAVar4,pAVar2,0x10,sVar3,sVar3,0);
          }
          (this->moreSegments).ptr = pAVar5;
          (this->moreSegments).size_ = (size_t)elementCount;
          (this->moreSegments).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
          lVar7 = (ulong)uVar11 - 1;
          lVar9 = 0;
          do {
            uVar6 = (ulong)*(uint *)((long)&pwVar10[1].content + lVar9);
            _kjCondition.right = (unsigned_long *)(offset + uVar6);
            _kjCondition.op.content.ptr = " >= ";
            _kjCondition.op.content.size_ = 5;
            _kjCondition.result = _kjCondition.right <= puVar8;
            if (puVar8 < _kjCondition.right) {
              _kjCondition.left = (unsigned_long)puVar8;
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[26]>
                        (&f,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
                         ,0x45,FAILED,"array.size() >= offset + segmentSize",
                         "_kjCondition,\"Message ends prematurely.\"",
                         (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,
                         (char (*) [26])"Message ends prematurely.");
              pAVar2 = pAVar1->ptr;
              if (pAVar2 != (ArrayPtr<const_capnp::word> *)0x0) {
                sVar3 = (this->moreSegments).size_;
                pAVar1->ptr = (ArrayPtr<const_capnp::word> *)0x0;
                (this->moreSegments).size_ = 0;
                pAVar4 = (this->moreSegments).disposer;
                (*(code *)**(undefined8 **)pAVar4)(pAVar4,pAVar2,0x10,sVar3,sVar3,0);
              }
              kj::_::Debug::Fault::~Fault(&f);
              return;
            }
            pAVar2 = pAVar1->ptr;
            *(word **)((long)&pAVar2->ptr + lVar9 * 4) = pwVar10 + offset;
            *(ulong *)((long)&pAVar2->size_ + lVar9 * 4) = uVar6;
            _kjCondition.right = (unsigned_long *)(uVar6 + offset);
            lVar9 = lVar9 + 4;
            lVar7 = lVar7 + -1;
            offset = (size_t)_kjCondition.right;
          } while (lVar7 != 0);
        }
        this->end = pwVar10 + (long)_kjCondition.right;
      }
    }
  }
  return;
}

Assistant:

FlatArrayMessageReader::FlatArrayMessageReader(
    kj::ArrayPtr<const word> array, ReaderOptions options)
    : MessageReader(options), end(array.end()) {
  if (array.size() < 1) {
    // Assume empty message.
    return;
  }

  const _::WireValue<uint32_t>* table =
      reinterpret_cast<const _::WireValue<uint32_t>*>(array.begin());

  uint segmentCount = table[0].get() + 1;
  size_t offset = segmentCount / 2u + 1u;

  KJ_REQUIRE(array.size() >= offset, "Message ends prematurely in segment table.") {
    return;
  }

  {
    uint segmentSize = table[1].get();

    KJ_REQUIRE(array.size() >= offset + segmentSize,
               "Message ends prematurely in first segment.") {
      return;
    }

    segment0 = array.slice(offset, offset + segmentSize);
    offset += segmentSize;
  }

  if (segmentCount > 1) {
    moreSegments = kj::heapArray<kj::ArrayPtr<const word>>(segmentCount - 1);

    for (uint i = 1; i < segmentCount; i++) {
      uint segmentSize = table[i + 1].get();

      KJ_REQUIRE(array.size() >= offset + segmentSize, "Message ends prematurely.") {
        moreSegments = nullptr;
        return;
      }

      moreSegments[i - 1] = array.slice(offset, offset + segmentSize);
      offset += segmentSize;
    }
  }

  end = array.begin() + offset;
}